

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

uint64_t __thiscall doublechecked::Roaring::xor_cardinality(Roaring *this,Roaring *r)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  uint64_t uVar4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int line;
  uint64_t uVar8;
  uint64_t uVar9;
  char *expression;
  unsigned_long result;
  
  uVar4 = roaring_bitmap_xor_cardinality((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  p_Var6 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    result = (unsigned_long)(uVar4 == (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    expression = "ans == r.check.size()";
    line = 0x21f;
  }
  else {
    p_Var7 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 == p_Var2) {
      result = (unsigned_long)
               (uVar4 == (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      expression = "ans == check.size()";
      line = 0x222;
    }
    else {
      _Var3 = p_Var6[1]._M_color;
      lVar5 = std::_Rb_tree_decrement(&p_Var2->_M_header);
      if ((*(_Rb_tree_color *)(lVar5 + 0x20) < _Var3) ||
         (_Var3 = p_Var7[1]._M_color, lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header),
         *(_Rb_tree_color *)(lVar5 + 0x20) < _Var3)) {
        result = (unsigned_long)
                 (uVar4 == (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                           (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
        expression = "ans == check.size() + r.check.size()";
        line = 0x226;
      }
      else {
        uVar8 = 0;
        uVar9 = uVar8;
        if ((_Rb_tree_header *)p_Var7 != p_Var2 || (_Rb_tree_header *)p_Var6 != p_Var1) {
          do {
            if ((_Rb_tree_header *)p_Var6 == p_Var1) {
              uVar9 = uVar8 + 1;
LAB_00107139:
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            }
            else {
              if ((_Rb_tree_header *)p_Var7 != p_Var2) {
                if (p_Var6[1]._M_color == p_Var7[1]._M_color) {
                  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                  uVar9 = uVar8;
                }
                else {
                  uVar9 = uVar8 + 1;
                  if (p_Var6[1]._M_color < p_Var7[1]._M_color) goto LAB_0010712c;
                }
                goto LAB_00107139;
              }
LAB_0010712c:
              uVar9 = uVar8 + 1;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            }
            uVar8 = uVar9;
          } while (((_Rb_tree_header *)p_Var6 != p_Var1) || ((_Rb_tree_header *)p_Var7 != p_Var2));
        }
        result = (unsigned_long)(uVar4 == uVar9);
        expression = "ans == count";
        line = 0x23c;
      }
    }
  }
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return uVar4;
}

Assistant:

uint64_t xor_cardinality(const Roaring &r) const {
        uint64_t ans = plain.xor_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            assert_true(ans == r.check.size());
        }  // this empty
        else if (r_it == r_it_end) {
            assert_true(ans == check.size());
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans ==
                        check.size() + r.check.size());  // obvious disjoint
        } else {                                         // may overlap
            uint64_t count = 0;
            while (it != it_end || r_it != r_it_end) {
                if (it == it_end) {
                    ++count;
                    ++r_it;
                } else if (r_it == r_it_end) {
                    ++count;
                    ++it;
                } else if (*it == *r_it) {
                    ++it;
                    ++r_it;
                }  // overlap uncounted
                else if (*it < *r_it) {
                    ++count;
                    ++it;
                } else {
                    ++count;
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }